

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O0

man_page *
clipp::make_man_page
          (man_page *__return_storage_ptr__,group *cli,doc_string *progname,doc_formatting *fmt)

{
  doc_formatting *fmt_00;
  doc_string *pdVar1;
  param_filter local_988;
  filter_function local_960;
  documentation local_940;
  string local_3c8;
  allocator<char> local_3a1;
  string local_3a0;
  string local_380;
  usage_lines local_360;
  string local_88;
  allocator<char> local_51;
  string local_50;
  undefined1 local_29;
  doc_formatting *local_28;
  doc_formatting *fmt_local;
  doc_string *progname_local;
  group *cli_local;
  man_page *man;
  
  local_29 = 0;
  local_28 = fmt;
  fmt_local = (doc_formatting *)progname;
  progname_local = (doc_string *)cli;
  cli_local = (group *)__return_storage_ptr__;
  man_page::man_page(__return_storage_ptr__);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"SYNOPSIS",&local_51);
  pdVar1 = progname_local;
  std::__cxx11::string::string((string *)&local_380,(string *)progname);
  usage_lines::usage_lines(&local_360,(group *)pdVar1,&local_380,local_28);
  usage_lines::str_abi_cxx11_(&local_88,&local_360);
  man_page::append_section(__return_storage_ptr__,&local_50,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  usage_lines::~usage_lines(&local_360);
  std::__cxx11::string::~string((string *)&local_380);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3a0,"OPTIONS",&local_3a1);
  pdVar1 = progname_local;
  fmt_00 = local_28;
  local_988.prefix_.field_2._M_allocated_capacity = 0;
  local_988.prefix_.field_2._8_8_ = 0;
  local_988.prefix_._M_dataplus = (_Alloc_hider)0x0;
  local_988.prefix_._1_7_ = 0;
  local_988.prefix_._M_string_length = 0;
  local_988.required_ = no;
  local_988.blocking_ = no;
  local_988.repeatable_ = no;
  local_988.hasDoc_ = no;
  local_988._36_4_ = 0;
  param_filter::param_filter(&local_988);
  std::function<bool(clipp::parameter_const&)>::function<clipp::param_filter,void>
            ((function<bool(clipp::parameter_const&)> *)&local_960,&local_988);
  documentation::documentation(&local_940,(group *)pdVar1,fmt_00,&local_960);
  documentation::str_abi_cxx11_(&local_3c8,&local_940);
  man_page::append_section(__return_storage_ptr__,&local_3a0,&local_3c8);
  std::__cxx11::string::~string((string *)&local_3c8);
  documentation::~documentation(&local_940);
  std::function<bool_(const_clipp::parameter_&)>::~function(&local_960);
  param_filter::~param_filter(&local_988);
  std::__cxx11::string::~string((string *)&local_3a0);
  std::allocator<char>::~allocator(&local_3a1);
  return __return_storage_ptr__;
}

Assistant:

inline man_page
make_man_page(const group& cli,
              doc_string progname = "",
              const doc_formatting& fmt = doc_formatting{})
{
    man_page man;
    man.append_section("SYNOPSIS", usage_lines(cli,progname,fmt).str());
    man.append_section("OPTIONS", documentation(cli,fmt).str());
    return man;
}